

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * atomunk(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  int iVar2;
  expr *peVar3;
  expr **ppeVar4;
  
  if (ctx->reverse == 0) {
    peVar3 = (expr *)calloc(0x48,1);
    peVar3->type = EXPR_ID;
    peVar3->str = (char *)v;
    peVar3->special = 2;
    iVar1 = ctx->atomsmax;
    if (iVar1 <= ctx->atomsnum) {
      iVar2 = 0x10;
      if (iVar1 != 0) {
        iVar2 = iVar1 * 2;
      }
      ctx->atomsmax = iVar2;
      ppeVar4 = (expr **)realloc(ctx->atoms,(long)iVar2 << 3);
      ctx->atoms = ppeVar4;
    }
    iVar1 = ctx->atomsnum;
    ctx->atomsnum = iVar1 + 1;
    ctx->atoms[iVar1] = peVar3;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomunk APROTO {
	if (ctx->reverse)
		return 0;
	struct expr *expr = makeex(EXPR_ID);
	expr->str = v;
	expr->special = 2;
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}